

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void configure_char_sheet(void)

{
  ui_entry_iterator *puVar1;
  ui_entry **ppuVar2;
  ui_entry *puVar3;
  char_sheet_resist *pcVar4;
  ui_entry *entry;
  wchar_t local_48;
  wchar_t j;
  wchar_t n;
  wchar_t i;
  ui_entry_iterator *ui_iter;
  char *test_categories [2];
  char *region_categories [4];
  
  test_categories[1] = "resistances";
  release_char_sheet_config();
  cached_config = (char_sheet_config *)mem_alloc(0x88);
  ui_iter = (ui_entry_iterator *)anon_var_dwarf_1134f1;
  test_categories[0] = "stat_modifiers";
  puVar1 = initialize_ui_entry_iterator(check_for_two_categories,&ui_iter,"stat_modifiers");
  local_48 = count_ui_entry_iterator(puVar1);
  if (L'\x05' < local_48) {
    local_48 = L'\x05';
  }
  cached_config->n_stat_mod_entries = local_48;
  ppuVar2 = (ui_entry **)mem_alloc((long)local_48 << 3);
  cached_config->stat_mod_entries = ppuVar2;
  for (j = L'\0'; j < local_48; j = j + L'\x01') {
    puVar3 = advance_ui_entry_iterator(puVar1);
    cached_config->stat_mod_entries[j] = puVar3;
  }
  release_ui_entry_iterator(puVar1);
  cached_config->res_nlabel = L'\x06';
  cached_config->res_cols = cached_config->res_nlabel + L'\x01' + (uint)(player->body).count;
  cached_config->res_rows = L'\0';
  for (j = L'\0'; j < L'\x04'; j = j + L'\x01') {
    cached_config->res_regions[j].col = j * (cached_config->res_cols + L'\x01');
    cached_config->res_regions[j].row = 7;
    cached_config->res_regions[j].width = cached_config->res_cols;
    test_categories[0] = test_categories[(long)j + 1];
    puVar1 = initialize_ui_entry_iterator
                       (check_for_two_categories,&ui_iter,test_categories[(long)j + 1]);
    local_48 = count_ui_entry_iterator(puVar1);
    if (0x16 < local_48 + L'\x02' + cached_config->res_regions[j].row) {
      local_48 = L'\x14' - cached_config->res_regions[j].row;
    }
    cached_config->n_resist_by_region[j] = local_48;
    pcVar4 = (char_sheet_resist *)mem_alloc((long)local_48 << 5);
    cached_config->resists_by_region[j] = pcVar4;
    for (entry._4_4_ = L'\0'; entry._4_4_ < local_48; entry._4_4_ = entry._4_4_ + L'\x01') {
      puVar3 = advance_ui_entry_iterator(puVar1);
      cached_config->resists_by_region[j][entry._4_4_].entry = puVar3;
      get_ui_entry_label(puVar3,cached_config->res_nlabel,true,
                         cached_config->resists_by_region[j][entry._4_4_].label);
      text_mbstowcs(cached_config->resists_by_region[j][entry._4_4_].label + 5,":",L'\x01');
    }
    release_ui_entry_iterator(puVar1);
    if (cached_config->res_rows < cached_config->n_resist_by_region[j]) {
      cached_config->res_rows = cached_config->n_resist_by_region[j];
    }
  }
  for (j = L'\0'; j < L'\x04'; j = j + L'\x01') {
    cached_config->res_regions[j].page_rows = cached_config->res_rows + L'\x02';
  }
  return;
}

Assistant:

static void configure_char_sheet(void)
{
	const char* region_categories[] = {
		"resistances",
		"abilities",
		"hindrances",
		"modifiers"
	};
	const char* test_categories[2];
	struct ui_entry_iterator* ui_iter;
	int i, n;

	release_char_sheet_config();

	cached_config = mem_alloc(sizeof(*cached_config));

	test_categories[0] = "CHAR_SCREEN1";
	test_categories[1] = "stat_modifiers";
	ui_iter = initialize_ui_entry_iterator(check_for_two_categories,
		test_categories, test_categories[1]);
	n = count_ui_entry_iterator(ui_iter);
	/*
	 * Linked to hardcoded stats display with STAT_MAX entries so only use
	 * that many.
	 */
	if (n > STAT_MAX) {
	    n = STAT_MAX;
	}
	cached_config->n_stat_mod_entries = n;
	cached_config->stat_mod_entries = mem_alloc(n *
		sizeof(*cached_config->stat_mod_entries));
	for (i = 0; i < n; ++i) {
		cached_config->stat_mod_entries[i] =
			advance_ui_entry_iterator(ui_iter);
	}
	release_ui_entry_iterator(ui_iter);

	cached_config->res_nlabel = 6;
	cached_config->res_cols =
		cached_config->res_nlabel + 1 + player->body.count;
	cached_config->res_rows = 0;
	for (i = 0; i < 4; ++i) {
		int j;

		cached_config->res_regions[i].col =
			i * (cached_config->res_cols + 1);
		cached_config->res_regions[i].row = 2 + STAT_MAX;
		cached_config->res_regions[i].width = cached_config->res_cols;

		test_categories[1] = region_categories[i];
		ui_iter = initialize_ui_entry_iterator(check_for_two_categories, test_categories, region_categories[i]);
		n = count_ui_entry_iterator(ui_iter);
		/*
		 * Fit in 24 row display; leave at least one row blank before
		 * prompt on last row.
		 */
		if (n + 2 + cached_config->res_regions[i].row > 22) {
		    n = 20 - cached_config->res_regions[i].row;
		}
		cached_config->n_resist_by_region[i] = n;
		cached_config->resists_by_region[i] = mem_alloc(n * sizeof(*cached_config->resists_by_region[i]));
		for (j = 0; j < n; ++j) {
			struct ui_entry *entry = advance_ui_entry_iterator(ui_iter);

			cached_config->resists_by_region[i][j].entry = entry;
			get_ui_entry_label(entry, cached_config->res_nlabel, true, cached_config->resists_by_region[i][j].label);
			(void) text_mbstowcs(cached_config->resists_by_region[i][j].label + 5, ":", 1);
		}
		release_ui_entry_iterator(ui_iter);

		if (cached_config->res_rows <
			cached_config->n_resist_by_region[i]) {
			cached_config->res_rows =
				cached_config->n_resist_by_region[i];
		}
	}
	for (i = 0; i < 4; ++i) {
		cached_config->res_regions[i].page_rows =
			cached_config->res_rows + 2;
	}
}